

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_api.c
# Opt level: O1

MPP_RET mpg4d_prepare(void *dec,MppPacket pkt,HalDecTask *task)

{
  MppPacket s;
  RK_U32 RVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  void *__src;
  size_t sVar4;
  ulong uVar5;
  void *__dest;
  RK_S64 v;
  ulong size;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((pkt == (MppPacket)0x0 || dec == (void *)0x0) || task == (HalDecTask *)0x0) {
    _mpp_log_l(2,"mpg4d_api","found NULL intput dec %p pkt %p task %p\n","mpg4d_prepare",dec,pkt,
               task);
    return MPP_ERR_NULL_PTR;
  }
  task->valid = 0;
  __src = mpp_packet_get_pos(pkt);
  sVar4 = mpp_packet_get_length(pkt);
  RVar1 = mpp_packet_get_eos(pkt);
  if (*(int *)((long)dec + 0x38) == 0) {
    if (*(long *)((long)dec + 0x18) == 0) {
      _mpp_log_l(2,"mpg4d_api","failed to malloc task buffer for hardware with size %d\n",
                 (char *)0x0,sVar4);
      return MPP_ERR_UNKNOW;
    }
    mpp_packet_set_length(*(MppPacket *)((long)dec + 0x30),*(size_t *)((long)dec + 0x28));
    uVar5 = (*(long *)((long)dec + 0x28) + sVar4 + 0xf & 0xfffffffffffffff0) + 0x40;
    if (*(ulong *)((long)dec + 0x20) < uVar5) {
      size = *(ulong *)((long)dec + 0x20);
      do {
        size = size * 2;
      } while (size < uVar5);
      *(ulong *)((long)dec + 0x20) = size;
      __dest = mpp_osal_malloc("mpg4d_prepare",size);
      if ((__dest == (void *)0x0) &&
         (_mpp_log_l(2,"mpg4d_api","Assertion %s failed at %s:%d\n",(char *)0x0,"dst",
                     "mpg4d_prepare",CONCAT44(uVar6,0xda)), (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      if (*(size_t *)((long)dec + 0x28) != 0) {
        memcpy(__dest,*(void **)((long)dec + 0x18),*(size_t *)((long)dec + 0x28));
      }
      mpp_osal_free("mpg4d_prepare",*(void **)((long)dec + 0x18));
      *(void **)((long)dec + 0x18) = __dest;
      mpp_packet_set_data(*(MppPacket *)((long)dec + 0x30),__dest);
      mpp_packet_set_size(*(MppPacket *)((long)dec + 0x30),*(size_t *)((long)dec + 0x20));
    }
    RVar2 = mpp_packet_get_flag(pkt);
    if (((RVar2 & 2) == 0) || (*(long *)((long)dec + 0x28) == 0)) {
      if ((*(int *)(*(long *)((long)dec + 0x40) + 0x24) == 0) ||
         (RVar2 = mpp_packet_get_flag(pkt), (RVar2 & 2) != 0)) {
        *(RK_U32 *)((long)dec + 0x38) = RVar1;
        (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(RVar1 & 1);
        if (sVar4 == 0 && RVar1 != 0) {
          mpg4d_flush(dec);
          return MPP_OK;
        }
        memcpy(*(void **)((long)dec + 0x18),__src,sVar4);
        mpp_packet_set_pos(*(MppPacket *)((long)dec + 0x30),*(void **)((long)dec + 0x18));
        mpp_packet_set_length(*(MppPacket *)((long)dec + 0x30),sVar4);
        s = *(MppPacket *)((long)dec + 0x30);
        v = mpp_packet_get_pts(pkt);
        mpp_packet_set_pts(s,v);
        mpp_packet_set_pos(pkt,(void *)(sVar4 + (long)__src));
        mpp_packet_set_length(pkt,0);
        task->valid = 1;
      }
      else {
        MVar3 = mpp_mpg4_parser_split
                          (*(Mpg4dParser *)((long)dec + 0x48),*(MppPacket *)((long)dec + 0x30),pkt);
        if (MVar3 == MPP_OK) {
          *(undefined8 *)((long)dec + 0x28) = 0;
          task->valid = 1;
        }
        else {
          task->valid = 0;
          sVar4 = mpp_packet_get_length(*(MppPacket *)((long)dec + 0x30));
          *(size_t *)((long)dec + 0x28) = sVar4;
        }
        RVar1 = mpp_packet_get_eos(*(MppPacket *)((long)dec + 0x30));
        *(RK_U32 *)((long)dec + 0x38) = RVar1;
        (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(RVar1 & 1);
      }
      task->input_packet = *(MppPacket *)((long)dec + 0x30);
    }
    else {
      *(undefined8 *)((long)dec + 0x28) = 0;
      task->valid = 1;
    }
    return MPP_OK;
  }
  _mpp_log_l(4,"mpg4d_api","has got eos packet.\n","mpg4d_prepare");
  mpp_packet_set_length(pkt,0);
  return MPP_OK;
}

Assistant:

static MPP_RET mpg4d_prepare(void *dec, MppPacket pkt, HalDecTask *task)
{
    Mpg4dCtx *p;
    RK_U8 *pos;
    size_t length;
    RK_U32 eos;

    if (NULL == dec || NULL == pkt || NULL == task) {
        mpp_err_f("found NULL intput dec %p pkt %p task %p\n", dec, pkt, task);
        return MPP_ERR_NULL_PTR;
    }

    task->valid = 0;
    p = (Mpg4dCtx *)dec;
    pos     = mpp_packet_get_pos(pkt);
    length  = mpp_packet_get_length(pkt);
    eos     = mpp_packet_get_eos(pkt);

    if (p->got_eos) {
        mpp_log_f("has got eos packet.\n");
        mpp_packet_set_length(pkt, 0);
        return MPP_OK;
    }

    if (NULL == p->stream) {
        mpp_err("failed to malloc task buffer for hardware with size %d\n", length);
        return MPP_ERR_UNKNOW;
    }
    mpp_packet_set_length(p->task_pkt, p->left_length);

    /*
    * Check have enough buffer to store stream
    * NOTE: total length is the left size plus the new incoming
    *       packet length.
    */
    size_t total_length = MPP_ALIGN(p->left_length + length, 16) + 64; // add extra 64 bytes in tails

    if (total_length > p->stream_size) {
        RK_U8 *dst = NULL;
        do {
            p->stream_size <<= 1;
        } while (total_length > p->stream_size);

        dst = mpp_malloc_size(RK_U8, p->stream_size);
        mpp_assert(dst);
        // NOTE: copy remaining stream to new buffer
        if (p->left_length > 0) {
            memcpy(dst, p->stream, p->left_length);
        }
        mpp_free(p->stream);
        p->stream = dst;
        mpp_packet_set_data(p->task_pkt, p->stream);
        mpp_packet_set_size(p->task_pkt, p->stream_size);
    }

    if (mpp_packet_get_flag(pkt) & MPP_PACKET_FLAG_EXTRA_DATA) {
        if (p->left_length > 0) {
            p->left_length = 0;
            task->valid = 1;
            return MPP_OK;
        }
    }

    if (!p->dec_cfg->base.split_parse ||
        (mpp_packet_get_flag(pkt) & MPP_PACKET_FLAG_EXTRA_DATA)) {
        p->got_eos = eos;
        task->flags.eos = eos;
        // NOTE: empty eos packet
        if (eos && !length) {
            mpg4d_flush(dec);
            return MPP_OK;
        }
        /*
         * Copy packet mode:
         * Decoder's user will insure each packet is one frame for process
         * Parser will just copy packet to the beginning of stream buffer
         */
        memcpy(p->stream, pos, length);
        mpp_packet_set_pos(p->task_pkt, p->stream);
        mpp_packet_set_length(p->task_pkt, length);
        mpp_packet_set_pts(p->task_pkt, mpp_packet_get_pts(pkt));
        // set input packet length to 0 here
        // indicate that the input packet has been all consumed
        mpp_packet_set_pos(pkt, pos + length);
        mpp_packet_set_length(pkt, 0);
        /* this step will enable the task and goto parse stage */
        task->valid = 1;
    } else {
        /*
         * Split packet mode:
         * Input packet can be any length and no need to be bound of on frame
         * Parser will do split frame operation to find the beginning and end of one frame
         */
        if (MPP_OK == mpp_mpg4_parser_split(p->parser, p->task_pkt, pkt)) {
            p->left_length = 0;
            task->valid = 1;
        } else {
            task->valid = 0;
            p->left_length = mpp_packet_get_length(p->task_pkt);
        }
        p->got_eos = mpp_packet_get_eos(p->task_pkt);
        task->flags.eos = p->got_eos;
    }
    task->input_packet = p->task_pkt;

    return MPP_OK;
}